

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_hostcheck.c
# Opt level: O0

int amqp_raw_equal(char *first,char *second)

{
  char cVar1;
  char cVar2;
  char *in_RSI;
  char *in_RDI;
  bool bVar3;
  char *local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    bVar3 = false;
    if (*local_8 != '\0') {
      bVar3 = *local_10 != '\0';
    }
    if (!bVar3) break;
    cVar1 = amqp_raw_toupper(*local_8);
    cVar2 = amqp_raw_toupper(*local_10);
    if (cVar1 != cVar2) break;
    local_8 = local_8 + 1;
    local_10 = local_10 + 1;
  }
  cVar1 = amqp_raw_toupper(*local_8);
  cVar2 = amqp_raw_toupper(*local_10);
  return (int)(cVar1 == cVar2);
}

Assistant:

static int
amqp_raw_equal(const char *first, const char *second)
{
  while (*first && *second) {
    if (amqp_raw_toupper(*first) != amqp_raw_toupper(*second)) {
      /* get out of the loop as soon as they don't match */
      break;
    }
    first++;
    second++;
  }
  /* we do the comparison here (possibly again), just to make sure that if
   * the loop above is skipped because one of the strings reached zero, we
   * must not return this as a successful match
   */
  return (amqp_raw_toupper(*first) == amqp_raw_toupper(*second));
}